

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  bool bVar2;
  value_type vVar3;
  byte bVar4;
  ulong uVar5;
  value_type *pvVar6;
  ulong uVar7;
  size_t sVar8;
  value_type vVar9;
  value_type *pvVar10;
  long lVar11;
  value_type avStack_28 [32];
  
  uVar5 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  pvVar10 = avStack_28 + iVar1;
  uVar7 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar7 / 100;
      *(undefined2 *)(pvVar10 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar7 + (int)uVar5 * -100) * 2)
      ;
      pvVar10 = pvVar10 + -2;
      bVar2 = 9999 < uVar7;
      uVar7 = uVar5;
    } while (bVar2);
  }
  pvVar6 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar7 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar8 = (it->super_truncating_iterator_base<char_*>).count_;
  vVar9 = it->blackhole_;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar11 = -1;
  }
  else {
    pvVar10[-1] = internal::basic_data<void>::DIGITS[(uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[uVar5 * 2 & 0x1fffffffe];
    lVar11 = -2;
  }
  pvVar10[lVar11] = bVar4;
  if (0 < iVar1) {
    lVar11 = 0;
    do {
      vVar3 = avStack_28[lVar11];
      if (sVar8 + lVar11 < uVar7) {
        *pvVar6 = avStack_28[lVar11];
        vVar3 = vVar9;
      }
      vVar9 = vVar3;
      pvVar6 = pvVar6 + (sVar8 + lVar11 < uVar7);
      lVar11 = lVar11 + 1;
    } while (iVar1 != lVar11);
    sVar8 = sVar8 + lVar11;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar6;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar7;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar8;
  it->blackhole_ = vVar9;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }